

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O3

void __thiscall bwtil::cw_bwt::initStructures(cw_bwt *this)

{
  ContextAutomata *this_00;
  undefined8 *puVar1;
  pointer pvVar2;
  void *pvVar3;
  pointer puVar4;
  ulint uVar5;
  pointer pDVar6;
  long lVar7;
  pointer pPVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long *plVar20;
  ostream *poVar21;
  double dVar22;
  ulong uVar23;
  double dVar24;
  byte bVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  cw_bwt *pcVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  allocator_type local_121;
  cw_bwt *local_120;
  double local_118;
  int local_10c;
  vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  local_108;
  double local_e8;
  undefined8 *local_e0;
  undefined1 local_d8 [40];
  pointer puStack_b0;
  pointer local_a8;
  undefined1 local_a0 [16];
  pointer local_90;
  undefined1 local_88 [16];
  pointer local_78;
  ulint local_70;
  undefined1 uStack_68;
  undefined7 uStack_67;
  undefined1 uStack_60;
  undefined8 uStack_5f;
  ulong local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  undefined1 extraout_var [56];
  
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)&local_108,this->number_of_contexts,&local_121);
  local_d8._16_8_ =
       (this->frequencies).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_108.
                super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar2 = (this->frequencies).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8._8_8_ =
       (this->frequencies).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_108.
                super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_108.
                super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_108.
  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_108.
  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._0_4_ = SUB84(pvVar2,0);
  local_d8._4_4_ = (undefined4)((ulong)pvVar2 >> 0x20);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_d8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_108);
  local_120 = this;
  if (this->number_of_contexts == 0) {
    uVar23 = 0;
  }
  else {
    lVar29 = 0;
    uVar26 = 0;
    do {
      pcVar30 = local_120;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           local_108.
           super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_108.
      super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = auVar11 << 0x40;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                 (ulong)local_120->sigma,(value_type *)&local_108,(allocator_type *)&local_121);
      pvVar2 = (pcVar30->frequencies).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = *(void **)((long)&(pvVar2->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar29);
      puVar1 = (undefined8 *)
               ((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar29);
      *puVar1 = CONCAT44(local_d8._4_4_,local_d8._0_4_);
      puVar1[1] = local_d8._8_8_;
      local_d8[0] = '\0';
      local_d8[1] = '\0';
      local_d8[2] = '\0';
      local_d8[3] = '\0';
      *(undefined8 *)
       ((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar29) = local_d8._16_8_;
      local_d8._16_8_ = (pointer)0x0;
      local_d8._4_4_ = 0;
      local_d8._8_8_ = SUB168(ZEXT816(0),4);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3);
        if ((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
        }
      }
      uVar26 = uVar26 + 1;
      lVar29 = lVar29 + 0x18;
      uVar23 = local_120->number_of_contexts;
    } while (uVar26 < uVar23);
  }
  pcVar30 = local_120;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,uVar23,
             (allocator_type *)&local_108);
  puVar4 = (pcVar30->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pcVar30->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CONCAT44(local_d8._4_4_,local_d8._0_4_);
  (pcVar30->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
  (pcVar30->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
  local_d8[0] = '\0';
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8._4_4_ = 0;
  local_d8._8_8_ = (pointer)0x0;
  local_d8._16_8_ = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
    if ((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
    }
  }
  if (pcVar30->number_of_contexts != 0) {
    puVar4 = (pcVar30->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar23 = 0;
    do {
      puVar4[uVar23] = 0;
      uVar23 = uVar23 + 1;
    } while (uVar23 < pcVar30->number_of_contexts);
  }
  if (pcVar30->verbose != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n*** Scanning input file to compute context frequencies ***",
               0x3b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    plVar20 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
    std::ostream::put((char)plVar20);
    std::ostream::flush();
  }
  iVar16 = (*pcVar30->bwIt->_vptr_BackwardIterator[4])();
  if ((char)iVar16 == '\0') {
    this_00 = &pcVar30->ca;
    iVar16 = -1;
    uVar23 = 0;
    do {
      uVar17 = (*pcVar30->bwIt->_vptr_BackwardIterator[3])();
      bVar25 = (byte)(pcVar30->ca).remapping.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17 & 0xff];
      uVar28 = (ulong)bVar25;
      puVar4 = (pcVar30->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + (pcVar30->ca).current_state;
      *puVar4 = *puVar4 + 1;
      uVar5 = (pcVar30->ca).current_state;
      pvVar2 = (pcVar30->frequencies).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar29 = *(long *)&pvVar2[uVar5].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data;
      uVar26 = (long)pvVar2[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar29 >> 3;
      if (uVar26 <= uVar28) goto LAB_00111ca7;
      plVar20 = (long *)(lVar29 + uVar28 * 8);
      *plVar20 = *plVar20 + 1;
      ContextAutomata::goTo(this_00,bVar25);
      iVar18 = (int)(uVar23 / pcVar30->n);
      if (((iVar16 < iVar18) && (iVar18 % 5 == 0)) && (local_120->verbose == true)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,"% done.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
        iVar16 = iVar18;
      }
      pcVar30 = local_120;
      iVar18 = (*local_120->bwIt->_vptr_BackwardIterator[4])();
      uVar23 = uVar23 + 100;
    } while ((char)iVar18 == '\0');
  }
  puVar4 = (pcVar30->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + (pcVar30->ca).current_state;
  *puVar4 = *puVar4 + 1;
  uVar5 = (pcVar30->ca).current_state;
  pvVar2 = (pcVar30->frequencies).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = pvVar2[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar2[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    *puVar4 = *puVar4 + 1;
    computeEmpiricalEntropy(pcVar30);
    if (pcVar30->verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Done.\n",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
    uVar26 = (pcVar30->n * 10) / pcVar30->number_of_contexts;
    local_e0 = (undefined8 *)operator_new(0xa8);
    local_e0[8] = 0;
    local_e0[9] = 0;
    local_e0[10] = 0;
    local_e0[0xb] = 0;
    local_e0[0xc] = 0;
    local_e0[0xd] = 0;
    local_e0[0xe] = 0;
    local_e0[0xf] = 0;
    *local_e0 = 0;
    local_e0[1] = 0;
    local_e0[2] = 0;
    local_e0[3] = 0;
    local_e0[4] = 0;
    local_e0[5] = 0;
    local_e0[6] = 0;
    local_e0[7] = 0;
    local_e0[0xd] = 0;
    local_e0[0xe] = 0;
    local_e0[0xf] = 0;
    local_e0[0x10] = 0;
    local_e0[0x11] = 0;
    local_e0[0x12] = 0;
    local_e0[0x13] = 0;
    local_e0[0x14] = 0;
    uVar23 = pcVar30->number_of_contexts;
    if (uVar23 != 0) {
      puVar4 = (pcVar30->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar28 = 0;
      do {
        uVar27 = puVar4[uVar28];
        plVar20 = local_e0 + 0x14;
        if (uVar27 < uVar26) {
          uVar27 = uVar27 / (uVar26 / 0x14) & 0xffffffff;
          if (0x14 < uVar27) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar27,0x15);
          }
          plVar20 = local_e0 + uVar27;
        }
        *plVar20 = *plVar20 + 1;
        uVar28 = uVar28 + 1;
      } while (uVar23 != uVar28);
    }
    uVar23 = pcVar30->n / uVar23;
    bVar25 = pcVar30->verbose;
    if ((bool)bVar25 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," Expected context size (if uniform text) is ",0x2c);
      poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21," characters",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
      std::ostream::put((char)poVar21);
      std::ostream::flush();
      bVar25 = pcVar30->verbose;
    }
    auVar12._8_8_ = in_XMM2_Qb;
    auVar12._0_8_ = in_XMM2_Qa;
    auVar11 = vcvtusi2sd_avx512f(auVar12,uVar23 + 1);
    auVar33._0_8_ = log2(auVar11._0_8_);
    auVar33._8_56_ = extraout_var;
    iVar16 = vcvttsd2usi_avx512f(auVar33._0_16_);
    auVar32._0_8_ = (double)(int)(0x100 / (ulong)(iVar16 + 1));
    auVar32._8_8_ = in_XMM2_Qb;
    auVar11 = vsqrtsd_avx(auVar32,auVar32);
    uVar19 = vcvttsd2usi_avx512f(auVar11);
    auVar13._8_8_ = in_XMM2_Qb;
    auVar13._0_8_ = in_XMM2_Qa;
    auVar11 = vcvtusi2sd_avx512f(auVar13,(int)(uVar23 >> 0xc) + 1);
    uVar17 = 2;
    if (2 < uVar19) {
      uVar17 = uVar19;
    }
    local_118 = log2(auVar11._0_8_);
    auVar14._8_8_ = in_XMM2_Qb;
    auVar14._0_8_ = in_XMM2_Qa;
    auVar11 = vcvtusi2sd_avx512f(auVar14,uVar17);
    local_e8 = log2(auVar11._0_8_);
    if ((bVar25 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 " Expected worst-case packed B-tree height (if uniform text) is ",0x3f);
      auVar34._0_8_ = local_118 / local_e8;
      auVar34._8_8_ = 0;
      uVar9 = vcmpsd_avx512f(ZEXT816(0),auVar34,1);
      bVar10 = (bool)((byte)uVar9 & 1);
      poVar21 = std::ostream::_M_insert<double>
                          ((double)((ulong)bVar10 * (long)auVar34._0_8_ +
                                   (ulong)!bVar10 * 0x3ff0000000000000));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
      std::ostream::put((char)poVar21);
      std::ostream::flush();
      bVar25 = pcVar30->verbose;
    }
    if ((bVar25 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\n*** Creating data structures (dynamic compressed strings and partial sums) ***",
                 0x4f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      plVar20 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
      std::ostream::put((char)plVar20);
      std::ostream::flush();
    }
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
              *)&local_108,pcVar30->number_of_contexts,(allocator_type *)&local_121);
    local_d8._16_8_ =
         (pcVar30->dynStrings).
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pcVar30->dynStrings).
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pDVar6 = (pcVar30->dynStrings).
             super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d8._8_8_ =
         (pcVar30->dynStrings).
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pcVar30->dynStrings).
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (pcVar30->dynStrings).
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
    local_d8._0_4_ = SUB84(pDVar6,0);
    local_d8._4_4_ = (undefined4)((ulong)pDVar6 >> 0x20);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
               *)local_d8);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
               *)&local_108);
    if (pcVar30->number_of_contexts != 0) {
      lVar29 = 0x68;
      local_10c = -1;
      dVar31 = 0.0;
      uVar23 = 0;
      dVar22 = 0.0;
      do {
        local_118 = dVar22;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_48,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(((pcVar30->frequencies).
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + (long)dVar31));
        DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::DynamicString
                  ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)local_d8,
                   &local_48);
        pDVar6 = (pcVar30->dynStrings).
                 super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)pDVar6 + lVar29 + -0x68) = local_d8._0_4_;
        pvVar3 = *(void **)((long)pDVar6 + lVar29 + -0x60);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar29 + -0x60);
        *puVar1 = local_d8._8_8_;
        puVar1[1] = local_d8._16_8_;
        local_d8._8_8_ = (pointer)0x0;
        *(undefined8 *)((long)pDVar6 + lVar29 + -0x50) = local_d8._24_8_;
        local_d8._16_8_ = SUB168(ZEXT816(0),4);
        local_d8._24_8_ = (pointer)0x0;
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        pvVar3 = *(void **)((long)pDVar6 + lVar29 + -0x48);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar29 + -0x48);
        *puVar1 = local_d8._32_8_;
        puVar1[1] = puStack_b0;
        register0x00001200 = ZEXT816(0) << 0x20;
        *(pointer *)((long)pDVar6 + lVar29 + -0x38) = local_a8;
        local_a8 = (pointer)0x0;
        local_e8 = dVar31;
        local_50 = uVar23;
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        puVar1 = (undefined8 *)((long)pDVar6 + lVar29 + -0x30);
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)pDVar6 + lVar29 + -0x20);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar29 + -0x30);
        *puVar1 = local_a0._0_8_;
        puVar1[1] = local_a0._8_8_;
        local_a0 = ZEXT816(0) << 0x20;
        *(pointer *)((long)pDVar6 + lVar29 + -0x20) = local_90;
        local_90 = (pointer)0x0;
        std::
        vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ::~vector(&local_108);
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._0_16_ =
             *(undefined1 (*) [16])((long)pDVar6 + lVar29 + -0x18);
        local_108.
        super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)pDVar6 + lVar29 + -8);
        puVar1 = (undefined8 *)((long)pDVar6 + lVar29 + -0x18);
        *puVar1 = local_88._0_8_;
        puVar1[1] = local_88._8_8_;
        local_88 = ZEXT816(0) << 0x20;
        *(pointer *)((long)pDVar6 + lVar29 + -8) = local_78;
        local_78 = (pointer)0x0;
        std::
        vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   *)&local_108);
        puVar1 = (undefined8 *)
                 ((long)&(pDVar6->child0).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + lVar29 + 1);
        *puVar1 = CONCAT17(uStack_60,uStack_67);
        puVar1[1] = uStack_5f;
        *(ulint *)(&pDVar6->number_of_internal_nodes + lVar29) = local_70;
        *(ulong *)&(((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    (&pDVar6->number_of_internal_nodes + lVar29 + 8))->
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl =
             CONCAT71(uStack_67,uStack_68);
        std::
        vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   *)local_88);
        std::
        vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
        ::~vector((vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                   *)local_a0);
        if ((pointer)local_d8._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_d8._32_8_);
        }
        uVar23 = local_50;
        dVar31 = local_e8;
        pcVar30 = local_120;
        if ((pointer)local_d8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_d8._8_8_);
        }
        if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        pvVar2 = (pcVar30->frequencies).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = *(long *)((long)&(pvVar2->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start + (long)dVar31);
        if (*(long *)((long)&(pvVar2->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish + (long)dVar31) != lVar7) {
          *(long *)((long)&(pvVar2->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish + (long)dVar31) = lVar7;
        }
        dVar24 = (double)pcVar30->number_of_contexts;
        iVar16 = (int)(uVar23 / (ulong)dVar24);
        if (((local_10c < iVar16) && (iVar16 % 10 == 0)) && (local_120->verbose == true)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"% done.",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
          std::ostream::put((char)poVar21);
          std::ostream::flush();
          dVar24 = (double)local_120->number_of_contexts;
          local_10c = iVar16;
        }
        dVar22 = (double)((long)local_118 + 1);
        uVar23 = uVar23 + 100;
        dVar31 = (double)((long)dVar31 + 0x18);
        lVar29 = lVar29 + 0x88;
        pcVar30 = local_120;
      } while ((ulong)dVar22 < (ulong)dVar24);
    }
    computeActualEntropy(pcVar30);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::vector
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)&local_108,
               pcVar30->number_of_contexts,(allocator_type *)&local_121);
    local_d8._16_8_ =
         (pcVar30->partial_sums).
         super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pcVar30->partial_sums).
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pPVar8 = (pcVar30->partial_sums).
             super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_d8._8_8_ =
         (pcVar30->partial_sums).
         super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pcVar30->partial_sums).
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (pcVar30->partial_sums).
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_108.
                  super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
    local_d8._0_4_ = SUB84(pPVar8,0);
    local_d8._4_4_ = (undefined4)((ulong)pPVar8 >> 0x20);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)local_d8);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)&local_108);
    if (pcVar30->number_of_contexts != 0) {
      lVar29 = 4;
      uVar23 = 0;
      do {
        PartialSums::PartialSums
                  ((PartialSums *)local_d8,pcVar30->sigma,
                   (pcVar30->lengths).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar23]);
        pPVar8 = (pcVar30->partial_sums).
                 super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)pPVar8 + lVar29 * 8 + -0x20);
        *puVar1 = CONCAT44(local_d8._4_4_,local_d8._0_4_);
        puVar1[1] = local_d8._8_8_;
        pvVar3 = *(void **)((long)pPVar8 + lVar29 * 8 + -0x10);
        puVar1 = (undefined8 *)((long)pPVar8 + lVar29 * 8 + -0x10);
        *puVar1 = local_d8._16_8_;
        puVar1[1] = local_d8._24_8_;
        *(undefined8 *)(&pPVar8->sigma + lVar29 * 8) = local_d8._32_8_;
        local_d8._16_8_ = (pointer)0x0;
        local_d8._24_8_ = (pointer)0x0;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = puStack_b0;
        stack0xffffffffffffff48 = auVar15 << 0x40;
        if ((pvVar3 != (void *)0x0) &&
           (operator_delete(pvVar3), (pointer)local_d8._16_8_ != (pointer)0x0)) {
          operator_delete((void *)local_d8._16_8_);
        }
        uVar23 = uVar23 + 1;
        lVar29 = lVar29 + 5;
      } while (uVar23 < pcVar30->number_of_contexts);
    }
    puVar1 = local_e0;
    bVar25 = pcVar30->verbose;
    if ((bool)bVar25 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n k-th order empirical entropy of the text is ",0x2e);
      poVar21 = std::ostream::_M_insert<double>(pcVar30->Hk);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
      std::ostream::put((char)poVar21);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," bits per symbol used (only compressed text): ",0x2e);
      poVar21 = std::ostream::_M_insert<double>(pcVar30->bits_per_symbol);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
      std::ostream::put((char)poVar21);
      std::ostream::flush();
      bVar25 = pcVar30->verbose;
    }
    if ((bVar25 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nData structures created.",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
    operator_delete(puVar1);
    return;
  }
  uVar28 = 0;
  uVar26 = 0;
LAB_00111ca7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar28,
             uVar26);
}

Assistant:

void initStructures(){

		frequencies = vector<vector<ulint> >(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++)
			frequencies[i] = vector<ulint>(sigma,0);

		lengths = vector<ulint>(number_of_contexts);

		for(ulint i=0;i<number_of_contexts;i++)
			lengths[i]=0;

		symbol s;

		ulint symbols_read=0;

		if(verbose) cout << "\n*** Scanning input file to compute context frequencies ***" << endl << endl;

		int perc,last_perc=-1;

		while(not bwIt->begin()){

			s = ca.ASCIItoCode( bwIt->read() );//this symbol has as context the current state of the automata

			lengths[ ca.currentState() ]++;//new symbol in this context:increment

			frequencies[ ca.currentState() ].at(s) = frequencies[ ca.currentState() ].at(s)+1;//increment the frequency of s in the context

			ca.goTo(s);

			perc = (100*symbols_read)/n;

			if(perc>last_perc and (perc%5)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}
			symbols_read++;

		}

		lengths[ ca.currentState() ]++;//first context in the text: will contain only terminator
		frequencies[ ca.currentState() ].at(0)++;//terminator

		computeEmpiricalEntropy();

		if(verbose) cout << " Done.\n" << endl;

		//99 intervals [i,i+100M/100] and one final interval i>100M

		//statistics:
		uint number_of_intervals = 20;
		ulint max_len = (10*n)/number_of_contexts;
		ulint step = max_len / number_of_intervals;
		ulint tot_intervals = number_of_intervals+1;

		vector<ulint> stats = vector<ulint>(tot_intervals,0);

		ulint max=0;
		for(ulint i=0;i<number_of_contexts;i++)
			if(lengths[i]>max)
				max=lengths[i];

		for(ulint i=0;i<number_of_contexts;i++){

			if(lengths[i]>=max_len)
				stats.at(tot_intervals-1) = stats.at(tot_intervals-1)+1;
			else{

				uint pos=lengths[i]/step;
				stats.at(pos) = stats.at(pos)+1;

			}

		}

		ulint exp_context_length = n/number_of_contexts;

		//if(verbose) cout << " Largest context has " << max << " characters" << endl;
		if(verbose) cout << " Expected context size (if uniform text) is " << exp_context_length << " characters" << endl;

		//compute expected packed B-tree height

		{

			uint nr_of_leaves = exp_context_length/W_leafs + 1;
			uint log2n = log2(exp_context_length+1);
			uint d = W_nodes/(log2n+1);
			uint b = sqrt(d); //worst-case tree fanout
			if(b<=1) b=2;
			double exp_height = (log2(nr_of_leaves)/log2(b));
			if(exp_height<=0) exp_height = 1;

			if(verbose) cout << " Expected worst-case packed B-tree height (if uniform text) is " << exp_height << endl ;

		}

		/*if(verbose) cout << " Context length statistics: " << endl;

		if(verbose){

			for(uint i=0;i<tot_intervals-1;i++)
				cout << " [" << i*step << ", " << (i+1)*step << "[ -> " << stats.at(i)<<endl;

			cout << " [ " << max_len <<", inf [ -> " << stats.at(tot_intervals-1)<<endl;

		}*/


		if(verbose) cout << "\n*** Creating data structures (dynamic compressed strings and partial sums) ***" << endl << endl;

		perc=0;
		last_perc=-1;

		dynStrings = vector<dynamic_string_t >(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++){

			dynStrings[i] = dynamic_string_t(frequencies[i]);
			frequencies[i].clear();//free memory

			perc = (100*i)/number_of_contexts;

			if(perc>last_perc and (perc%10)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}

		}

		computeActualEntropy();

		partial_sums = vector<PartialSums>(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++)
			partial_sums[i] = PartialSums(sigma,lengths[i]);

		if(verbose){

			cout << "\n k-th order empirical entropy of the text is " << empiricalEntropy() << endl;
			cout << " bits per symbol used (only compressed text): " << actualEntropy() << endl;

		}

		if(verbose) cout << "\nData structures created." << endl;

	}